

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextVoid(char *str_id,ImGuiPopupFlags popup_flags)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  uint in_ESI;
  char *in_RDI;
  int mouse_button;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiPopupFlags in_stack_00000030;
  ImGuiID in_stack_00000034;
  ImGuiHoveredFlags in_stack_fffffffffffffff0;
  
  if (in_RDI == (char *)0x0) {
    in_RDI = "void_context";
  }
  ImGuiWindow::GetID(_mouse_button,in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  bVar1 = IsMouseReleased(in_ESI & 0x1f);
  if (((bVar1) && (bVar1 = IsWindowHovered(in_stack_fffffffffffffff0), !bVar1)) &&
     (pIVar2 = GetTopMostPopupModal(), pIVar2 == (ImGuiWindow *)0x0)) {
    OpenPopupEx(in_stack_00000034,in_stack_00000030);
  }
  bVar1 = BeginPopupEx((ImGuiID)g,window._4_4_);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextVoid(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!str_id)
        str_id = "void_context";
    ImGuiID id = window->GetID(str_id);
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && !IsWindowHovered(ImGuiHoveredFlags_AnyWindow))
        if (GetTopMostPopupModal() == NULL)
            OpenPopupEx(id, popup_flags);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings);
}